

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O1

void yy_1_param(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  G->val[-6] = (PVIPNode *)0x0;
  G->val[-4] = (PVIPNode *)0x0;
  G->val[-3] = (PVIPNode *)0x0;
  G->val[-2] = (PVIPNode *)0x0;
  G->val[-1] = (PVIPNode *)0x0;
  return;
}

Assistant:

YY_ACTION(void) yy_1_param(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define is_ref G->val[-1]
#define is_rw G->val[-2]
#define is_copy G->val[-3]
#define d G->val[-4]
#define v G->val[-5]
#define i G->val[-6]
  yyprintf((stderr, "do yy_1_param"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {i=NULL; d=NULL; is_copy=NULL; is_rw=NULL; is_ref=NULL; }\n"));
  i=NULL; d=NULL; is_copy=NULL; is_rw=NULL; is_ref=NULL; ;
#undef is_ref
#undef is_rw
#undef is_copy
#undef d
#undef v
#undef i
}